

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O1

void lts2::PerformTVL1OnImageFAST
               (Mat *anImage,Size *patchSize,LBDOperator *LBD,Mat *result,int iterations,
               float lambda,float patchMean)

{
  int iVar1;
  int iVar2;
  LBDOperator *LBD_00;
  _InputArray *p_Var3;
  undefined8 uVar4;
  pointer pKVar5;
  int in_register_00000084;
  Size patchSize_00;
  int iVar6;
  float fVar7;
  float fVar8;
  Rect ROI;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> fastPoints;
  Mat target;
  Mat ocount;
  Mat inputPatch;
  Mat resultPatch;
  Mat patchOnes;
  Mat freak;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> local_448;
  _OutputArray local_428;
  _InputArray local_410;
  LBDOperator *local_3f8;
  _InputArray local_3f0 [4];
  int local_390;
  int local_38c;
  ulong local_388;
  ulong local_380;
  double local_378 [12];
  _InputArray local_318 [4];
  long *local_2b8;
  undefined8 uStack_2b0;
  long local_2a8 [12];
  Mat local_248 [96];
  Mat local_1e8 [152];
  Mat local_150 [96];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  patchSize_00.height = in_register_00000084;
  patchSize_00.width = iterations;
  if ((*(uint *)anImage & 0xfff) == 5) {
    local_448.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_448.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ExtractFastKeypoints(anImage,&local_448);
    local_380 = **(ulong **)(anImage + 0x40) << 0x20 | **(ulong **)(anImage + 0x40) >> 0x20;
    cv::Mat::create(result,&local_380,5);
    local_318[0].obj = &local_2b8;
    local_2a8[0] = 0;
    local_2a8[1] = 0;
    local_2b8 = (long *)0x0;
    uStack_2b0 = 0;
    local_318[0].flags = -0x3efdfffa;
    local_318[0].sz = (Size)&DAT_400000001;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)result,local_318);
    local_388 = **(ulong **)(anImage + 0x40) << 0x20 | **(ulong **)(anImage + 0x40) >> 0x20;
    local_2a8[0] = 0;
    local_2a8[1] = 0;
    local_2b8 = (long *)0x0;
    uStack_2b0 = 0;
    cv::Mat::Mat((Mat *)local_318,&local_388,5);
    local_390 = patchSize->width;
    local_38c = patchSize->height;
    cv::Mat::ones(&local_2b8,&local_390,5);
    local_3f8 = LBD;
    cv::Mat::Mat(local_f0);
    (**(code **)(*local_2b8 + 0x18))(local_2b8,&local_2b8,local_f0,0xffffffff);
    cv::Mat::~Mat(local_1e8);
    cv::Mat::~Mat(local_248);
    cv::Mat::~Mat((Mat *)local_2a8);
    cv::Mat::Mat((Mat *)&local_2b8);
    cv::Mat::Mat(local_90);
    cv::Mat::Mat(local_150);
    if (local_448.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_448.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar1 = patchSize->width;
      iVar2 = patchSize->height;
      pKVar5 = local_448.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        fVar8 = *(float *)(pKVar5 + 4);
        fVar7 = rintf(*(float *)pKVar5);
        iVar6 = (int)fVar7 - iVar1 / 2;
        fVar8 = rintf(fVar8);
        local_454 = (int)fVar8 - iVar2 / 2;
        local_450 = patchSize->width;
        local_44c = patchSize->height;
        local_458 = iVar6;
        if ((((-1 < local_454) && (local_454 + local_44c <= *(int *)(anImage + 8))) && (-1 < iVar6))
           && (iVar6 + local_450 <= *(int *)(anImage + 0xc))) {
          cv::Mat::Mat((Mat *)local_378,anImage,(Rect_ *)&local_458);
          local_3f0[0].sz.width = 0;
          local_3f0[0].sz.height = 0;
          local_3f0[0].flags = 0x2010000;
          local_3f0[0].obj = &local_2b8;
          cv::Mat::copyTo((_OutputArray *)local_378);
          LBD_00 = local_3f8;
          cv::Mat::~Mat((Mat *)local_378);
          fVar8 = patchMean;
          if (patchMean < 0.0) {
            local_3f0[0].sz.width = 0;
            local_3f0[0].sz.height = 0;
            local_3f0[0].flags = 0x1010000;
            local_3f0[0].obj = &local_2b8;
            cv::noArray();
            cv::mean((_InputArray *)local_378,local_3f0);
            fVar8 = (float)local_378[0];
          }
          (*(LBD_00->super_LinearOperator)._vptr_LinearOperator[2])(LBD_00,&local_2b8,local_90);
          RealReconstructionWithTVL1(local_150,LBD_00,local_90,iterations,lambda,patchSize_00,fVar8)
          ;
          cv::Mat::Mat((Mat *)local_378,result,(Rect_ *)&local_458);
          local_3f0[0].sz.width = 0;
          local_3f0[0].sz.height = 0;
          local_3f0[0].flags = 0x1010000;
          local_410.sz.width = 0;
          local_410.sz.height = 0;
          local_410.flags = 0x1010000;
          local_410.obj = local_150;
          local_428.super__InputArray.sz.width = 0;
          local_428.super__InputArray.sz.height = 0;
          local_428.super__InputArray.flags = -0x3dff0000;
          local_428.super__InputArray.obj = (Mat *)local_378;
          local_3f0[0].obj = (Mat *)local_378;
          p_Var3 = (_InputArray *)cv::noArray();
          cv::add(local_3f0,&local_410,&local_428,p_Var3,-1);
          cv::Mat::Mat((Mat *)local_3f0,(Mat *)local_318,(Rect_ *)&local_458);
          cv::Mat::operator=((Mat *)local_378,(Mat *)local_3f0);
          cv::Mat::~Mat((Mat *)local_3f0);
          local_3f0[0].sz.width = 0;
          local_3f0[0].sz.height = 0;
          local_3f0[0].flags = 0x1010000;
          local_410.sz.width = 0;
          local_410.sz.height = 0;
          local_410.flags = 0x1010000;
          local_410.obj = local_f0;
          local_428.super__InputArray.sz.width = 0;
          local_428.super__InputArray.sz.height = 0;
          local_428.super__InputArray.flags = -0x3dff0000;
          local_428.super__InputArray.obj = (Mat *)local_378;
          local_3f0[0].obj = (Mat *)local_378;
          p_Var3 = (_InputArray *)cv::noArray();
          patchSize_00.width = -1;
          patchSize_00.height = 0;
          cv::add(local_3f0,&local_410,&local_428,p_Var3,-1);
          cv::Mat::~Mat((Mat *)local_378);
        }
        pKVar5 = pKVar5 + 0x1c;
      } while (pKVar5 != local_448.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    finalize(result,(Mat *)local_318);
    cv::Mat::~Mat(local_150);
    cv::Mat::~Mat(local_90);
    cv::Mat::~Mat((Mat *)&local_2b8);
    cv::Mat::~Mat(local_f0);
    cv::Mat::~Mat((Mat *)local_318);
    if (local_448.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_448.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_448.
                            super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_448.
                            super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8,"anImage.type() == CV_32F && anImage.channels() == 1","");
  uVar4 = cv::error(-0xd7,(string *)&local_2b8,"PerformTVL1OnImageFAST",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                    ,0x1ff);
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8,local_2a8[0] + 1);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

void lts2::PerformTVL1OnImageFAST(cv::Mat const &anImage, cv::Size patchSize,
                                 LBDOperator &LBD, cv::Mat &result, int iterations, float lambda, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);

  // Extract image FAST points
  std::vector<cv::KeyPoint> fastPoints;
  ExtractFastKeypoints(anImage, fastPoints);

  // Result image
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));

  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);

  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  int const pradius_x = patchSize.width / 2;
  int const pradius_y = patchSize.height / 2;

  std::vector<cv::KeyPoint>::const_iterator p_fast;

  for (p_fast = fastPoints.begin(); p_fast != fastPoints.end(); ++p_fast)
  {
    int x = (int)rintf(p_fast->pt.x) - pradius_x;
    int y = (int)rintf(p_fast->pt.y) - pradius_y;

    cv::Rect ROI(x, y, patchSize.width, patchSize.height);
    if ( y < 0 || y+patchSize.height > anImage.rows ||
         x < 0 || x+patchSize.width > anImage.cols )
      continue;

    anImage(ROI).copyTo(inputPatch);
    float pmean = patchMean;
    if (pmean < 0.0)
    {
      cv::Scalar mean = cv::mean(inputPatch);
      pmean = (float)mean[0];
    }

    LBD.Apply(inputPatch, freak);
    lts2::RealReconstructionWithTVL1(resultPatch, LBD, freak, iterations,
                                    lambda, patchSize, pmean);

    cv::Mat target = result(ROI);
    target += resultPatch;

    target = ocount(ROI);
    target += patchOnes;
  }

  finalize(result, ocount);
}